

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::DockNodePreviewDockRender
               (ImGuiWindow *host_window,ImGuiDockNode *host_node,ImGuiWindow *root_payload,
               ImGuiDockPreviewData *data)

{
  float *pfVar1;
  ImDrawList *pIVar2;
  ImVec2 IVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  ImGuiContext *pIVar12;
  ImU32 IVar13;
  ImU32 col;
  uint uVar14;
  ImGuiWindow *pIVar15;
  ImVec2 *pIVar16;
  char *__function;
  undefined8 extraout_RDX;
  ulong uVar17;
  ImGuiTabBar *pIVar18;
  int overlay_n_1;
  ImGuiDockPreviewData *pIVar19;
  long lVar20;
  int overlay_n;
  long lVar21;
  ImGuiDockNode *pIVar22;
  ulong uVar23;
  ImGuiContext *g;
  ImGuiContext *pIVar24;
  bool bVar25;
  float fVar26;
  undefined4 uVar27;
  float fVar28;
  ImRect tab_bb;
  ImRect overlay_rect;
  ImDrawList *overlay_draw_lists [2];
  float local_fc;
  ImRect local_f8;
  undefined1 local_e8 [8];
  ImVec2 aIStack_e0 [2];
  ImGuiDockPreviewData *local_d0;
  undefined1 local_c8 [16];
  ulong local_b8;
  ImGuiWindow *local_b0;
  ImGuiWindow *local_a8;
  ImVec2 local_a0;
  ImVec2 local_98;
  ImGuiContext *local_90;
  undefined1 local_88 [16];
  ImGuiDockNode *local_70;
  long local_68;
  ImU32 local_60;
  ImU32 local_5c;
  ImDrawList *local_58 [3];
  ulong local_40;
  ImGuiTabBar *local_38;
  
  pIVar24 = GImGui;
  local_d0 = data;
  if (GImGui->CurrentWindow != host_window) {
    __assert_fail("g.CurrentWindow == host_window",
                  "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                  ,0x39da,
                  "void ImGui::DockNodePreviewDockRender(ImGuiWindow *, ImGuiDockNode *, ImGuiWindow *, const ImGuiDockPreviewData *)"
                 );
  }
  bVar25 = (GImGui->IO).ConfigDockingTransparentPayload;
  lVar20 = 1;
  local_58[0] = GetViewportDrawList(host_window->Viewport,1,"##Foreground");
  if (host_window->Viewport != root_payload->Viewport && (bVar25 & 1U) == 0) {
    local_58[1] = GetViewportDrawList(root_payload->Viewport,1,"##Foreground");
    lVar20 = 2;
  }
  pIVar12 = GImGui;
  local_90 = pIVar24;
  fVar26 = 0.6;
  bVar25 = (bVar25 & 1U) != 0;
  if (!bVar25) {
    fVar26 = 0.4;
  }
  local_e8 = *(undefined1 (*) [8])((GImGui->Style).Colors + 0x26);
  uVar4 = (GImGui->Style).Colors[0x26].z;
  uVar5 = (GImGui->Style).Colors[0x26].w;
  local_c8._0_4_ = (GImGui->Style).Alpha;
  aIStack_e0[0].y = fVar26 * (float)local_c8._0_4_ * (float)uVar5;
  aIStack_e0[0].x = (float)uVar4;
  if (bVar25) {
    uVar27 = 0x3f666666;
  }
  else {
    uVar27 = 0x3f333333;
  }
  local_b8 = CONCAT44(local_b8._4_4_,uVar27);
  if (bVar25) {
    fVar26 = 1.2;
    local_88._0_4_ = 0x3f4ccccd;
  }
  else {
    fVar26 = 1.0;
    local_88._0_4_ = 0x3f19999a;
  }
  local_b0 = host_window;
  local_68 = lVar20;
  IVar13 = ColorConvertFloat4ToU32((ImVec4 *)local_e8);
  local_e8 = *(undefined1 (*) [8])((pIVar12->Style).Colors + 0x26);
  uVar6 = (pIVar12->Style).Colors[0x26].z;
  uVar7 = (pIVar12->Style).Colors[0x26].w;
  aIStack_e0[0].y = (float)local_b8 * (float)local_c8._0_4_ * (float)uVar7;
  aIStack_e0[0].x = (float)uVar6;
  local_5c = ColorConvertFloat4ToU32((ImVec4 *)local_e8);
  local_e8 = *(undefined1 (*) [8])((pIVar12->Style).Colors + 0x26);
  uVar8 = (pIVar12->Style).Colors[0x26].z;
  uVar9 = (pIVar12->Style).Colors[0x26].w;
  aIStack_e0[0].y = fVar26 * (float)local_c8._0_4_ * (float)uVar9;
  aIStack_e0[0].x = (float)uVar8;
  local_60 = ColorConvertFloat4ToU32((ImVec4 *)local_e8);
  local_e8 = *(undefined1 (*) [8])((pIVar12->Style).Colors + 0x34);
  uVar10 = (pIVar12->Style).Colors[0x34].z;
  uVar11 = (pIVar12->Style).Colors[0x34].w;
  aIStack_e0[0].y = (float)local_88._0_4_ * (float)local_c8._0_4_ * (float)uVar11;
  aIStack_e0[0].x = (float)uVar10;
  col = ColorConvertFloat4ToU32((ImVec4 *)local_e8);
  lVar20 = local_68;
  pIVar15 = local_b0;
  if (root_payload->DockNodeAsHost == (ImGuiDockNode *)0x0) {
    uVar17 = 0;
  }
  else {
    uVar17 = CONCAT71((int7)((ulong)extraout_RDX >> 8),
                      (root_payload->DockNodeAsHost->Windows).Size < 1);
  }
  local_70 = host_node;
  if (local_d0->IsDropAllowed == true) {
    pIVar16 = &(local_d0->FutureNode).Pos;
    local_e8 = *(undefined1 (*) [8])pIVar16;
    aIStack_e0[0].y = (local_d0->FutureNode).Pos.y + (local_d0->FutureNode).Size.y;
    aIStack_e0[0].x = (local_d0->FutureNode).Pos.x + (local_d0->FutureNode).Size.x;
    local_c8._0_4_ = (undefined4)uVar17;
    if (local_d0->SplitDir == -1 && (uVar17 & 1) == 0) {
      fVar26 = (pIVar12->Style).FramePadding.y;
      local_e8._4_4_ = fVar26 + fVar26 + pIVar12->FontSize + (local_d0->FutureNode).Pos.y;
      local_e8._0_4_ = pIVar16->x;
    }
    local_a8 = root_payload;
    if ((local_d0->SplitDir != -1) || (local_d0->IsCenterAvailable == true)) {
      lVar21 = 0;
      do {
        ImDrawList::AddRectFilled
                  (local_58[lVar21],(ImVec2 *)local_e8,aIStack_e0,IVar13,pIVar15->WindowRounding,0);
        lVar21 = lVar21 + 1;
      } while (lVar20 != lVar21);
    }
    uVar17 = (ulong)(uint)local_c8._0_4_;
    root_payload = local_a8;
  }
  pIVar22 = local_70;
  pIVar24 = local_90;
  pIVar19 = local_d0;
  if (((((~local_d0->IsDropAllowed | (byte)uVar17) & 1) != 0) || (local_d0->SplitDir != -1)) ||
     (local_d0->IsCenterAvailable != true)) goto LAB_00145f16;
  local_e8._0_4_ = 0.0;
  local_e8._4_4_ = 0.0;
  aIStack_e0[0].x = 0.0;
  aIStack_e0[0].y = 0.0;
  DockNodeCalcTabBarLayout
            (&local_d0->FutureNode,(ImRect *)0x0,(ImRect *)local_e8,(ImVec2 *)0x0,(ImVec2 *)0x0);
  uVar27 = local_e8._0_4_;
  local_fc = (float)local_e8._0_4_;
  local_b8 = CONCAT44(local_b8._4_4_,local_e8._4_4_);
  if ((pIVar22 == (ImGuiDockNode *)0x0) || (pIVar22->TabBar == (ImGuiTabBar *)0x0)) {
    if ((local_b0->Flags & 0x20000000) == 0) {
      local_c8._0_4_ = (pIVar24->Style).ItemInnerSpacing.x;
      pIVar15 = local_b0;
      goto LAB_00145bf9;
    }
  }
  else {
    if ((pIVar22->MergedFlags & 0x3000) == 0) {
      local_fc = pIVar22->TabBar->WidthAllTabs + (pIVar24->Style).ItemInnerSpacing.x;
    }
    else {
      if ((pIVar22->Windows).Size < 1) {
        __function = "T &ImVector<ImGuiWindow *>::operator[](int) [T = ImGuiWindow *]";
LAB_001461cb:
        __assert_fail("i >= 0 && i < Size",
                      "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.h"
                      ,0x706,__function);
      }
      local_c8._0_4_ = (pIVar24->Style).ItemInnerSpacing.x;
      pIVar15 = *(pIVar22->Windows).Data;
LAB_00145bf9:
      IVar3 = TabItemCalcSize(pIVar15->Name,pIVar15->HasCloseButton);
      local_fc = IVar3.x + (float)local_c8._0_4_;
    }
    local_fc = (float)uVar27 + local_fc;
  }
  pIVar22 = root_payload->DockNodeAsHost;
  if (pIVar22 == (ImGuiDockNode *)0x0) {
LAB_00145c59:
    pIVar18 = (ImGuiTabBar *)0x0;
  }
  else {
    if ((pIVar22->TabBar->Tabs).Size < (pIVar22->Windows).Size) {
      __assert_fail("root_payload->DockNodeAsHost->Windows.Size <= root_payload->DockNodeAsHost->TabBar->Tabs.Size"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                    ,0x3a0e,
                    "void ImGui::DockNodePreviewDockRender(ImGuiWindow *, ImGuiDockNode *, ImGuiWindow *, const ImGuiDockPreviewData *)"
                   );
    }
    if (pIVar22 == (ImGuiDockNode *)0x0) goto LAB_00145c59;
    pIVar18 = pIVar22->TabBar;
  }
  if (pIVar18 == (ImGuiTabBar *)0x0) {
    uVar14 = 1;
  }
  else {
    uVar14 = (pIVar18->Tabs).Size;
  }
  pIVar19 = local_d0;
  if (0 < (int)uVar14) {
    uVar23 = (ulong)uVar14;
    uVar17 = 0;
    local_38 = pIVar18;
    local_40 = uVar23;
    local_a8 = root_payload;
    do {
      pIVar15 = root_payload;
      if (pIVar18 != (ImGuiTabBar *)0x0) {
        if ((long)(pIVar18->Tabs).Size <= (long)uVar17) {
          __function = "T &ImVector<ImGuiTabItem>::operator[](int) [T = ImGuiTabItem]";
          goto LAB_001461cb;
        }
        pIVar15 = (pIVar18->Tabs).Data[uVar17].Window;
      }
      if ((pIVar18 == (ImGuiTabBar *)0x0) || (pIVar15 != (ImGuiWindow *)0x0)) {
        local_88._0_8_ = uVar17;
        bVar25 = DockNodeIsDropAllowedOne(pIVar15,local_b0);
        if (bVar25) {
          IVar3 = TabItemCalcSize(pIVar15->Name,pIVar15->HasCloseButton);
          local_f8.Min.y = (float)local_b8;
          local_f8.Min.x = local_fc;
          local_f8.Max.y = IVar3.y + (float)local_b8;
          local_f8.Max.x = local_fc + IVar3.x;
          uVar14 = (pIVar15->DockStyle).Colors[0];
          fVar26 = (GImGui->Style).Alpha;
          if (fVar26 < 1.0) {
            uVar14 = (int)(long)((float)(uVar14 >> 0x18) * fVar26) << 0x18 | uVar14 & 0xffffff;
          }
          local_c8._0_4_ = (pIVar15->DockStyle).Colors[3];
          if (fVar26 < 1.0) {
            local_c8._0_4_ =
                 (int)(long)(fVar26 * (float)((uint)local_c8._0_4_ >> 0x18)) << 0x18 |
                 local_c8._0_4_ & 0xffffff;
          }
          local_fc = local_fc + IVar3.x + (pIVar24->Style).ItemInnerSpacing.x;
          PushStyleColor(0,uVar14);
          lVar20 = 0;
          do {
            uVar14 = pIVar15->Flags;
            if (local_f8.Min.x < (float)local_e8._0_4_) {
LAB_00145e01:
              ImDrawList::PushClipRect(local_58[lVar20],(ImVec2)local_e8,aIStack_e0[0],false);
            }
            else {
              if (local_f8.Min.y < (float)local_e8._4_4_) goto LAB_00145e01;
              if (aIStack_e0[0].x < local_f8.Max.x) goto LAB_00145e01;
              if (aIStack_e0[0].y < local_f8.Max.y) goto LAB_00145e01;
            }
            uVar14 = uVar14 >> 0x14 & 1 | 0x800000;
            pIVar2 = local_58[lVar20];
            TabItemBackground(pIVar2,&local_f8,uVar14,local_c8._0_4_);
            TabItemLabelAndCloseButton
                      (pIVar2,&local_f8,uVar14,(local_90->Style).FramePadding,pIVar15->Name,0,0,
                       false,(bool *)0x0,(bool *)0x0);
            if (local_f8.Min.x < (float)local_e8._0_4_) {
LAB_00145eb5:
              ImDrawList::PopClipRect(pIVar2);
            }
            else {
              if (local_f8.Min.y < (float)local_e8._4_4_) goto LAB_00145eb5;
              if (aIStack_e0[0].x < local_f8.Max.x) goto LAB_00145eb5;
              if (aIStack_e0[0].y < local_f8.Max.y) goto LAB_00145eb5;
            }
            lVar20 = lVar20 + 1;
          } while (local_68 != lVar20);
          PopStyleColor(1);
          pIVar18 = local_38;
          root_payload = local_a8;
          uVar23 = local_40;
          pIVar24 = local_90;
        }
        uVar17 = local_88._0_8_;
        pIVar19 = local_d0;
      }
      uVar17 = uVar17 + 1;
    } while (uVar17 != uVar23);
  }
LAB_00145f16:
  fVar26 = (pIVar24->Style).FrameRounding;
  fVar28 = 3.0;
  if (3.0 <= fVar26) {
    fVar28 = fVar26;
  }
  local_b0 = (ImGuiWindow *)CONCAT44(local_b0._4_4_,fVar28);
  pIVar15 = (ImGuiWindow *)pIVar19->DropRectsDraw;
  pIVar22 = local_70;
  uVar17 = 0xffffffffffffffff;
  local_a8 = pIVar15;
  while( true ) {
    if (uVar17 == 4) {
      return;
    }
    local_b8 = uVar17 + 1;
    fVar26 = (((ImRect *)((long)pIVar15 + local_b8 * 0x10))->Min).x;
    if ((fVar26 < (((ImRect *)((long)pIVar15 + local_b8 * 0x10))->Max).x ||
         fVar26 == (((ImRect *)((long)pIVar15 + local_b8 * 0x10))->Max).x) &&
       (fVar26 = (((ImRect *)((long)pIVar15 + local_b8 * 0x10))->Min).y,
       pfVar1 = &(((ImRect *)((long)pIVar15 + local_b8 * 0x10))->Max).y,
       fVar26 < *pfVar1 || fVar26 == *pfVar1)) {
      pIVar16 = (ImVec2 *)((long)pIVar15 + local_b8 * 0x10);
      local_e8 = *(undefined1 (*) [8])pIVar16;
      aIStack_e0[0] = pIVar16[1];
      local_f8.Min.x = (*pIVar16).x;
      local_f8.Min.x = local_f8.Min.x + 2.0;
      local_f8.Min.y = (*pIVar16).y;
      local_f8.Min.y = local_f8.Min.y + 2.0;
      local_f8.Max.x = pIVar16[1].x;
      local_f8.Max.x = local_f8.Max.x + -2.0;
      local_f8.Max.y = pIVar16[1].y;
      local_f8.Max.y = local_f8.Max.y + -2.0;
      if ((pIVar19->SplitDir != (uint)uVar17) ||
         (IVar13 = local_60, pIVar19->IsSplitDirExplicit == false)) {
        IVar13 = local_5c;
      }
      lVar20 = 0;
      do {
        fVar26 = local_f8.Max.x;
        local_88 = ZEXT416((uint)local_f8.Min.x);
        local_c8 = ZEXT416((uint)(local_f8.Min.y + local_f8.Max.y));
        pIVar2 = local_58[lVar20];
        ImDrawList::AddRectFilled(pIVar2,(ImVec2 *)local_e8,aIStack_e0,IVar13,local_b0._0_4_,0);
        ImDrawList::AddRect(pIVar2,&local_f8.Min,&local_f8.Max,col,local_b0._0_4_,0,1.0);
        local_c8._0_4_ = (float)local_c8._0_4_ * 0.5;
        if (uVar17 < 2) {
          local_a0.x = (float)(int)(((float)local_88._0_4_ + fVar26) * 0.5);
          local_98.y = local_f8.Min.y;
          local_a0.y = local_f8.Max.y;
          local_98.x = local_a0.x;
          ImDrawList::AddLine(pIVar2,&local_98,&local_a0,col,1.0);
        }
        if (((uint)uVar17 & 0xfffffffe) == 2) {
          local_a0.y = (float)(int)(float)local_c8._0_4_;
          local_98.x = local_f8.Min.x;
          local_a0.x = local_f8.Max.x;
          local_98.y = local_a0.y;
          ImDrawList::AddLine(pIVar2,&local_98,&local_a0,col,1.0);
        }
        lVar20 = lVar20 + 1;
        pIVar15 = local_a8;
        pIVar19 = local_d0;
        pIVar22 = local_70;
        pIVar24 = local_90;
      } while (local_68 != lVar20);
    }
    if ((pIVar22 != (ImGuiDockNode *)0x0) && ((pIVar22->MergedFlags & 0x10) != 0)) break;
    uVar17 = local_b8;
    if ((pIVar24->IO).ConfigDockingNoSplit == true) {
      return;
    }
  }
  return;
}

Assistant:

static void ImGui::DockNodePreviewDockRender(ImGuiWindow* host_window, ImGuiDockNode* host_node, ImGuiWindow* root_payload, const ImGuiDockPreviewData* data)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(g.CurrentWindow == host_window);   // Because we rely on font size to calculate tab sizes

    // With this option, we only display the preview on the target viewport, and the payload viewport is made transparent.
    // To compensate for the single layer obstructed by the payload, we'll increase the alpha of the preview nodes.
    const bool is_transparent_payload = g.IO.ConfigDockingTransparentPayload;

    // In case the two windows involved are on different viewports, we will draw the overlay on each of them.
    int overlay_draw_lists_count = 0;
    ImDrawList* overlay_draw_lists[2];
    overlay_draw_lists[overlay_draw_lists_count++] = GetForegroundDrawList(host_window->Viewport);
    if (host_window->Viewport != root_payload->Viewport && !is_transparent_payload)
        overlay_draw_lists[overlay_draw_lists_count++] = GetForegroundDrawList(root_payload->Viewport);

    // Draw main preview rectangle
    const ImU32 overlay_col_main = GetColorU32(ImGuiCol_DockingPreview, is_transparent_payload ? 0.60f : 0.40f);
    const ImU32 overlay_col_drop = GetColorU32(ImGuiCol_DockingPreview, is_transparent_payload ? 0.90f : 0.70f);
    const ImU32 overlay_col_drop_hovered = GetColorU32(ImGuiCol_DockingPreview, is_transparent_payload ? 1.20f : 1.00f);
    const ImU32 overlay_col_lines = GetColorU32(ImGuiCol_NavWindowingHighlight, is_transparent_payload ? 0.80f : 0.60f);

    // Display area preview
    const bool can_preview_tabs = (root_payload->DockNodeAsHost == NULL || root_payload->DockNodeAsHost->Windows.Size > 0);
    if (data->IsDropAllowed)
    {
        ImRect overlay_rect = data->FutureNode.Rect();
        if (data->SplitDir == ImGuiDir_None && can_preview_tabs)
            overlay_rect.Min.y += GetFrameHeight();
        if (data->SplitDir != ImGuiDir_None || data->IsCenterAvailable)
            for (int overlay_n = 0; overlay_n < overlay_draw_lists_count; overlay_n++)
                overlay_draw_lists[overlay_n]->AddRectFilled(overlay_rect.Min, overlay_rect.Max, overlay_col_main, host_window->WindowRounding);
    }

    // Display tab shape/label preview unless we are splitting node (it generally makes the situation harder to read)
    if (data->IsDropAllowed && can_preview_tabs && data->SplitDir == ImGuiDir_None && data->IsCenterAvailable)
    {
        // Compute target tab bar geometry so we can locate our preview tabs
        ImRect tab_bar_rect;
        DockNodeCalcTabBarLayout(&data->FutureNode, NULL, &tab_bar_rect, NULL, NULL);
        ImVec2 tab_pos = tab_bar_rect.Min;
        if (host_node && host_node->TabBar)
        {
            if (!host_node->IsHiddenTabBar() && !host_node->IsNoTabBar())
                tab_pos.x += host_node->TabBar->WidthAllTabs + g.Style.ItemInnerSpacing.x; // We don't use OffsetNewTab because when using non-persistent-order tab bar it is incremented with each Tab submission.
            else
                tab_pos.x += g.Style.ItemInnerSpacing.x + TabItemCalcSize(host_node->Windows[0]->Name, host_node->Windows[0]->HasCloseButton).x;
        }
        else if (!(host_window->Flags & ImGuiWindowFlags_DockNodeHost))
        {
            tab_pos.x += g.Style.ItemInnerSpacing.x + TabItemCalcSize(host_window->Name, host_window->HasCloseButton).x; // Account for slight offset which will be added when changing from title bar to tab bar
        }

        // Draw tab shape/label preview (payload may be a loose window or a host window carrying multiple tabbed windows)
        if (root_payload->DockNodeAsHost)
            IM_ASSERT(root_payload->DockNodeAsHost->Windows.Size <= root_payload->DockNodeAsHost->TabBar->Tabs.Size);
        ImGuiTabBar* tab_bar_with_payload = root_payload->DockNodeAsHost ? root_payload->DockNodeAsHost->TabBar : NULL;
        const int payload_count = tab_bar_with_payload ? tab_bar_with_payload->Tabs.Size : 1;
        for (int payload_n = 0; payload_n < payload_count; payload_n++)
        {
            // DockNode's TabBar may have non-window Tabs manually appended by user
            ImGuiWindow* payload_window = tab_bar_with_payload ? tab_bar_with_payload->Tabs[payload_n].Window : root_payload;
            if (tab_bar_with_payload && payload_window == NULL)
                continue;
            if (!DockNodeIsDropAllowedOne(payload_window, host_window))
                continue;

            // Calculate the tab bounding box for each payload window
            ImVec2 tab_size = TabItemCalcSize(payload_window->Name, payload_window->HasCloseButton);
            ImRect tab_bb(tab_pos.x, tab_pos.y, tab_pos.x + tab_size.x, tab_pos.y + tab_size.y);
            tab_pos.x += tab_size.x + g.Style.ItemInnerSpacing.x;
            const ImU32 overlay_col_text = GetColorU32(payload_window->DockStyle.Colors[ImGuiWindowDockStyleCol_Text]);
            const ImU32 overlay_col_tabs = GetColorU32(payload_window->DockStyle.Colors[ImGuiWindowDockStyleCol_TabActive]);
            PushStyleColor(ImGuiCol_Text, overlay_col_text);
            for (int overlay_n = 0; overlay_n < overlay_draw_lists_count; overlay_n++)
            {
                ImGuiTabItemFlags tab_flags = ImGuiTabItemFlags_Preview | ((payload_window->Flags & ImGuiWindowFlags_UnsavedDocument) ? ImGuiTabItemFlags_UnsavedDocument : 0);
                if (!tab_bar_rect.Contains(tab_bb))
                    overlay_draw_lists[overlay_n]->PushClipRect(tab_bar_rect.Min, tab_bar_rect.Max);
                TabItemBackground(overlay_draw_lists[overlay_n], tab_bb, tab_flags, overlay_col_tabs);
                TabItemLabelAndCloseButton(overlay_draw_lists[overlay_n], tab_bb, tab_flags, g.Style.FramePadding, payload_window->Name, 0, 0, false, NULL, NULL);
                if (!tab_bar_rect.Contains(tab_bb))
                    overlay_draw_lists[overlay_n]->PopClipRect();
            }
            PopStyleColor();
        }
    }

    // Display drop boxes
    const float overlay_rounding = ImMax(3.0f, g.Style.FrameRounding);
    for (int dir = ImGuiDir_None; dir < ImGuiDir_COUNT; dir++)
    {
        if (!data->DropRectsDraw[dir + 1].IsInverted())
        {
            ImRect draw_r = data->DropRectsDraw[dir + 1];
            ImRect draw_r_in = draw_r;
            draw_r_in.Expand(-2.0f);
            ImU32 overlay_col = (data->SplitDir == (ImGuiDir)dir && data->IsSplitDirExplicit) ? overlay_col_drop_hovered : overlay_col_drop;
            for (int overlay_n = 0; overlay_n < overlay_draw_lists_count; overlay_n++)
            {
                ImVec2 center = ImFloor(draw_r_in.GetCenter());
                overlay_draw_lists[overlay_n]->AddRectFilled(draw_r.Min, draw_r.Max, overlay_col, overlay_rounding);
                overlay_draw_lists[overlay_n]->AddRect(draw_r_in.Min, draw_r_in.Max, overlay_col_lines, overlay_rounding);
                if (dir == ImGuiDir_Left || dir == ImGuiDir_Right)
                    overlay_draw_lists[overlay_n]->AddLine(ImVec2(center.x, draw_r_in.Min.y), ImVec2(center.x, draw_r_in.Max.y), overlay_col_lines);
                if (dir == ImGuiDir_Up || dir == ImGuiDir_Down)
                    overlay_draw_lists[overlay_n]->AddLine(ImVec2(draw_r_in.Min.x, center.y), ImVec2(draw_r_in.Max.x, center.y), overlay_col_lines);
            }
        }

        // Stop after ImGuiDir_None
        if ((host_node && (host_node->MergedFlags & ImGuiDockNodeFlags_NoSplit)) || g.IO.ConfigDockingNoSplit)
            return;
    }
}